

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgroup_controller.cpp
# Opt level: O3

int CgroupController::init(EVP_PKEY_CTX *ctx)

{
  _Alloc_hider _Var1;
  int extraout_EAX;
  Config *this;
  path *__lhs;
  ContextManager *pCVar2;
  error_code error;
  path path;
  path local_b8;
  path local_90;
  path local_68;
  path local_40;
  
  this = Config::get();
  __lhs = Config::get_cgroup_root_abi_cxx11_(this);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ctx,
             auto_format);
  std::filesystem::__cxx11::operator/(&local_b8,__lhs,&local_90);
  std::filesystem::__cxx11::path::path<char[8],std::filesystem::__cxx11::path>
            (&local_68,(char (*) [8])"libsbox",auto_format);
  std::filesystem::__cxx11::operator/(&local_40,&local_b8,&local_68);
  std::filesystem::__cxx11::path::~path(&local_68);
  std::filesystem::__cxx11::path::~path(&local_b8);
  std::filesystem::__cxx11::path::~path(&local_90);
  local_68._M_pathname._M_dataplus._M_p._0_4_ = 0;
  local_68._M_pathname._M_string_length = std::_V2::system_category();
  std::filesystem::remove(&local_40,(error_code *)&local_68);
  if ((int)local_68._M_pathname._M_dataplus._M_p != 0) {
    pCVar2 = ContextManager::get();
    _Var1._M_p = local_40._M_pathname._M_dataplus._M_p;
    (**(code **)(*(long *)local_68._M_pathname._M_string_length + 0x20))
              (&local_90,local_68._M_pathname._M_string_length,
               (int)local_68._M_pathname._M_dataplus._M_p);
    format_abi_cxx11_(&local_b8._M_pathname,"Cannot remove dir \'%s\': %s",_Var1._M_p,
                      local_90._M_pathname._M_dataplus._M_p);
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_pathname._M_dataplus._M_p != &local_b8._M_pathname.field_2) {
      operator_delete(local_b8._M_pathname._M_dataplus._M_p,
                      local_b8._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_pathname._M_dataplus._M_p != &local_90._M_pathname.field_2) {
      operator_delete(local_90._M_pathname._M_dataplus._M_p,
                      local_90._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  std::filesystem::create_directories(&local_40,(error_code *)&local_68);
  if ((int)local_68._M_pathname._M_dataplus._M_p != 0) {
    pCVar2 = ContextManager::get();
    (**(code **)(*(long *)local_68._M_pathname._M_string_length + 0x20))
              (&local_90,local_68._M_pathname._M_string_length,
               (int)local_68._M_pathname._M_dataplus._M_p);
    format_abi_cxx11_(&local_b8._M_pathname,"Cannot create dir \'%s\': %s",
                      local_40._M_pathname._M_dataplus._M_p,local_90._M_pathname._M_dataplus._M_p);
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_pathname._M_dataplus._M_p != &local_b8._M_pathname.field_2) {
      operator_delete(local_b8._M_pathname._M_dataplus._M_p,
                      local_b8._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_pathname._M_dataplus._M_p != &local_90._M_pathname.field_2) {
      operator_delete(local_90._M_pathname._M_dataplus._M_p,
                      local_90._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  std::filesystem::__cxx11::path::~path(&local_40);
  return extraout_EAX;
}

Assistant:

void CgroupController::init(const std::string &name) {
    fs::path path = Config::get().get_cgroup_root() / name / "libsbox";
    std::error_code error;
    fs::remove(path, error);
    if (error) {
        die(format("Cannot remove dir '%s': %s", path.c_str(), error.message().c_str()));
    }
    fs::create_directories(path, error);
    if (error) {
        die(format("Cannot create dir '%s': %s", path.c_str(), error.message().c_str()));
    }
}